

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

int bsize_to_tx_size_cat(BLOCK_SIZE bsize)

{
  int depth;
  BLOCK_SIZE bsize_local;
  
  return ""[bsize] - 1;
}

Assistant:

static inline int bsize_to_tx_size_cat(BLOCK_SIZE bsize) {
  assert(bsize < BLOCK_SIZES_ALL);
  static const uint8_t bsize_to_tx_size_depth_table[BLOCK_SIZES_ALL] = {
    0, 1, 1, 1, 2, 2, 2, 3, 3, 3, 4, 4, 4, 4, 4, 4, 2, 2, 3, 3, 4, 4,
  };
  const int depth = bsize_to_tx_size_depth_table[bsize];
  assert(depth <= MAX_TX_CATS);
  return depth - 1;
}